

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void cimg_library::CImgDisplay::_render_resize<unsigned_short,unsigned_short>
               (unsigned_short *ptrs,uint ws,uint hs,unsigned_short *ptrd,uint wd,uint hd)

{
  unsigned_long uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ushort uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  unsigned_long *puVar10;
  unsigned_short *puVar11;
  uint uVar12;
  ulong uVar13;
  ulongT old;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  CImg<unsigned_long> off_y;
  CImg<unsigned_long> off_x;
  unsigned_long local_78;
  CImg<unsigned_long> local_70;
  CImg<unsigned_long> local_50;
  
  uVar8 = CONCAT44(0,wd);
  CImg<unsigned_long>::CImg(&local_50,wd,1,1,1);
  CImg<unsigned_long>::CImg(&local_70,hd + 1,1,1,1);
  auVar5 = _DAT_00254090;
  if (wd == ws) {
    local_78 = 1;
    CImg<unsigned_long>::fill(&local_50,&local_78);
  }
  else if (wd != 0) {
    lVar7 = uVar8 - 1;
    auVar15._8_4_ = (int)lVar7;
    auVar15._0_8_ = lVar7;
    auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar13 = 0;
    auVar15 = auVar15 ^ _DAT_00254090;
    auVar16 = _DAT_00254080;
    auVar17 = (undefined1  [16])0x0;
    do {
      auVar18 = auVar16 ^ auVar5;
      auVar20._0_4_ = -(uint)(auVar15._0_4_ < auVar18._0_4_);
      auVar20._4_4_ = -(uint)(auVar15._4_4_ < auVar18._4_4_);
      auVar20._8_4_ = -(uint)(auVar15._8_4_ < auVar18._8_4_);
      auVar20._12_4_ = -(uint)(auVar15._12_4_ < auVar18._12_4_);
      auVar19._4_4_ = -(uint)(auVar18._4_4_ == auVar15._4_4_);
      auVar19._12_4_ = -(uint)(auVar18._12_4_ == auVar15._12_4_);
      auVar19._0_4_ = auVar19._4_4_;
      auVar19._8_4_ = auVar19._12_4_;
      auVar18 = auVar19 & auVar20;
      auVar21._4_4_ = auVar20._4_4_;
      auVar21._0_4_ = auVar20._4_4_;
      auVar21._8_4_ = auVar20._12_4_;
      auVar21._12_4_ = auVar20._12_4_;
      auVar21 = auVar21 | auVar18;
      lVar7 = auVar16._8_8_;
      uVar12 = ~auVar21._0_4_;
      if ((uVar12 & 1) != 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar8;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (auVar16._0_8_ + 1) * (ulong)ws;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = SUB168(auVar3 / auVar2,0);
      }
      uVar4 = auVar21._8_2_ ^ 0xffff;
      if ((uVar4 & 1) != 0) {
        auVar18._8_8_ = ((lVar7 + 1) * (ulong)ws) / uVar8;
      }
      if ((uVar12 & 1) != 0) {
        *(long *)((long)local_50._data + uVar13) = auVar18._0_8_ - auVar17._8_8_;
      }
      if ((uVar4 & 1) != 0) {
        *(long *)((long)local_50._data + uVar13 + 8) = auVar18._8_8_ - auVar18._0_8_;
      }
      auVar16._0_8_ = auVar16._0_8_ + 2;
      auVar16._8_8_ = lVar7 + 2;
      uVar13 = uVar13 + 0x10;
      auVar17 = auVar18;
    } while ((uVar8 * 8 + 8 & 0xfffffffffffffff0) != uVar13);
  }
  if (hd == hs) {
    local_78 = (unsigned_long)ws;
    CImg<unsigned_long>::fill(&local_70,&local_78);
  }
  else {
    puVar10 = local_70._data;
    if (hd != 0) {
      uVar8 = (ulong)hs;
      uVar13 = (ulong)hd;
      uVar14 = 0;
      do {
        uVar6 = uVar8 / hd;
        *puVar10 = (uVar6 - uVar14) * (ulong)ws;
        puVar10 = puVar10 + 1;
        uVar8 = uVar8 + hs;
        uVar13 = uVar13 - 1;
        uVar14 = uVar6;
      } while (uVar13 != 0);
    }
    *puVar10 = 0;
  }
  if (hd != 0) {
    uVar8 = (ulong)wd;
    uVar12 = 0;
    puVar10 = local_70._data;
    do {
      if (wd != 0) {
        lVar7 = 0;
        lVar9 = 0;
        puVar11 = ptrs;
        do {
          ptrd[lVar9] = *puVar11;
          puVar11 = puVar11 + local_50._data[lVar9];
          lVar9 = lVar9 + 1;
          lVar7 = lVar7 + -2;
        } while (wd != (uint)lVar9);
        ptrd = (unsigned_short *)((long)ptrd - lVar7);
      }
      uVar1 = *puVar10;
      while( true ) {
        uVar12 = uVar12 + 1;
        puVar10 = puVar10 + 1;
        if ((uVar1 != 0) || (hd <= uVar12)) break;
        memcpy(ptrd,ptrd + -uVar8,uVar8 * 2);
        uVar1 = *puVar10;
        ptrd = ptrd + uVar8;
      }
      ptrs = ptrs + uVar1;
    } while (uVar12 < hd);
  }
  if ((local_70._is_shared == false) && (local_70._data != (unsigned_long *)0x0)) {
    operator_delete__(local_70._data);
  }
  if ((local_50._is_shared == false) && (local_50._data != (unsigned_long *)0x0)) {
    operator_delete__(local_50._data);
  }
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      typedef typename cimg::last<T,cimg_ulong>::type ulongT;
      const ulongT one = (ulongT)1;
      CImg<ulongT> off_x(wd), off_y(hd + 1);
      if (wd==ws) off_x.fill(1);
      else {
        ulongT *poff_x = off_x._data, curr = 0;
        for (unsigned int x = 0; x<wd; ++x) {
          const ulongT old = curr;
          curr = (x + one)*ws/wd;
          *(poff_x++) = curr - old;
        }
      }
      if (hd==hs) off_y.fill(ws);
      else {
        ulongT *poff_y = off_y._data, curr = 0;
        for (unsigned int y = 0; y<hd; ++y) {
          const ulongT old = curr;
          curr = (y + one)*hs/hd;
          *(poff_y++) = ws*(curr - old);
        }
        *poff_y = 0;
      }
      ulongT *poff_y = off_y._data;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        ulongT *poff_x = off_x._data;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poff_x++); }
        ++y;
        ulongT dy = *(poff_y++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poff_y++)) {}
        ptrs+=dy;
      }
    }